

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O3

long vorbis_book_decodevv_add(codebook *book,float **a,long offset,int ch,oggpack_buffer *b,int n)

{
  long lVar1;
  float *pfVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  if (0 < book->used_entries) {
    lVar4 = offset / (long)ch;
    lVar7 = (long)(int)((n + offset) / (long)ch);
    if (lVar4 < lVar7) {
      iVar8 = 0;
      do {
        lVar5 = decode_packed_entry_number(book,b);
        if (lVar5 == -1) {
          return -1;
        }
        lVar1 = book->dim;
        if (0 < lVar1 && lVar4 < lVar7) {
          pfVar2 = book->valuelist;
          lVar6 = 1;
          do {
            iVar9 = iVar8 + 1;
            a[iVar8][lVar4] = pfVar2[lVar5 * lVar1 + lVar6 + -1] + a[iVar8][lVar4];
            iVar8 = iVar9;
            if (iVar9 == ch) {
              iVar8 = 0;
            }
            lVar4 = (ulong)(iVar9 == ch) + lVar4;
          } while ((lVar4 < lVar7) && (bVar3 = lVar6 < lVar1, lVar6 = lVar6 + 1, bVar3));
        }
      } while (lVar4 < lVar7);
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevv_add(codebook *book,float **a,long offset,int ch,
                              oggpack_buffer *b,int n){

  long i,j,entry;
  int chptr=0;
  if(book->used_entries>0){
    int m=(offset+n)/ch;
    for(i=offset/ch;i<m;){
      entry = decode_packed_entry_number(book,b);
      if(entry==-1)return(-1);
      {
        const float *t = book->valuelist+entry*book->dim;
        for (j=0;i<m && j<book->dim;j++){
          a[chptr++][i]+=t[j];
          if(chptr==ch){
            chptr=0;
            i++;
          }
        }
      }
    }
  }
  return(0);
}